

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2closest_cell_query_base.h
# Opt level: O3

void __thiscall
S2ClosestCellQueryBase<S2MinDistance>::AddRange
          (S2ClosestCellQueryBase<S2MinDistance> *this,RangeIterator *range)

{
  pointer pCVar1;
  Label LVar2;
  int32 iVar3;
  int iVar4;
  S2LogMessage local_20;
  
  S2CellIndex::ContentsIterator::StartUnion(&this->contents_it_,range);
  iVar4 = (this->contents_it_).node_.label;
  if (iVar4 != -1) {
    do {
      MaybeAddResult(this,(S2CellId)(this->contents_it_).node_.cell_id.id_,iVar4);
      if ((this->contents_it_).node_.label == -1) {
        S2LogMessage::S2LogMessage
                  (&local_20,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cell_index.h"
                   ,599,kFatal,(ostream *)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_20.stream_,"Check failed: !done() ",0x16);
        abort();
      }
      iVar4 = (this->contents_it_).node_.parent;
      if (iVar4 <= (this->contents_it_).node_cutoff_) {
        (this->contents_it_).node_cutoff_ = (this->contents_it_).next_node_cutoff_;
        (this->contents_it_).node_.label = -1;
        return;
      }
      pCVar1 = (((this->contents_it_).cell_tree_)->
               super__Vector_base<S2CellIndex::CellNode,_std::allocator<S2CellIndex::CellNode>_>).
               _M_impl.super__Vector_impl_data._M_start + iVar4;
      LVar2 = pCVar1->label;
      iVar3 = pCVar1->parent;
      (this->contents_it_).node_.cell_id.id_ = (pCVar1->cell_id).id_;
      (this->contents_it_).node_.label = LVar2;
      (this->contents_it_).node_.parent = iVar3;
      iVar4 = (this->contents_it_).node_.label;
    } while (iVar4 != -1);
  }
  return;
}

Assistant:

void S2ClosestCellQueryBase<Distance>::AddRange(const RangeIterator& range) {
  for (contents_it_.StartUnion(range);
       !contents_it_.done(); contents_it_.Next()) {
    MaybeAddResult(contents_it_.cell_id(), contents_it_.label());
  }
}